

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserTester_2000_2999.cpp
# Opt level: O0

void __thiscall psy::C::ParserTester::case2115(ParserTester *this)

{
  Expectation *pEVar1;
  string local_1e8;
  Expectation local_1c8;
  Expectation local_110;
  allocator<char> local_41;
  string local_40;
  code *local_20;
  offset_in_ParserTester_to_subr x;
  ParserTester *local_10;
  ParserTester *this_local;
  
  local_20 = case0904;
  x = 0;
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"sizeof ( x ) y ;",&local_41);
  Expectation::Expectation(&local_1c8);
  std::__cxx11::string::string
            ((string *)&local_1e8,
             (string *)&Parser::DiagnosticsReporter::ID_of_ExpectedToken_abi_cxx11_);
  pEVar1 = Expectation::diagnostic(&local_1c8,Error,&local_1e8);
  Expectation::Expectation(&local_110,pEVar1);
  parseStatement(this,&local_40,&local_110);
  Expectation::~Expectation(&local_110);
  std::__cxx11::string::~string((string *)&local_1e8);
  Expectation::~Expectation(&local_1c8);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  return;
}

Assistant:

void ParserTester::case2115()
{
    /*
     Despite the parsing similarities between `typeof' and `sizeof',
     mind the difference between this test case and the following:

     `typeof ( x ) y ;'

     This would be a valid declaration-statement, and the `y' doesn't
     belong to the parsing of `typeof': it's the declarator.
     */

    CROSS_REFERENCE_TEST(ParserTester::case0904);

    parseStatement("sizeof ( x ) y ;",
                   Expectation().diagnostic(Expectation::ErrorOrWarn::Error,
                                               Parser::DiagnosticsReporter::ID_of_ExpectedToken));
}